

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExistingFile.cpp
# Opt level: O0

ExistingFileNamer * __thiscall ApprovalTests::ExistingFile::getNamer(ExistingFile *this)

{
  string *in_RSI;
  Options *in_RDI;
  Options *this_00;
  string local_30 [48];
  
  this_00 = in_RDI;
  ::std::__cxx11::string::string(local_30,(string *)&in_RSI->_M_string_length);
  ExistingFileNamer::ExistingFileNamer((ExistingFileNamer *)this_00,in_RSI,in_RDI);
  ::std::__cxx11::string::~string(local_30);
  return (ExistingFileNamer *)in_RDI;
}

Assistant:

ExistingFileNamer ExistingFile::getNamer()
    {
        return ExistingFileNamer(filePath, options_);
    }